

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManPrintCo_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  
  uVar3 = *(ulong *)pObj & 0x1fffffff;
  if (uVar3 != 0x1fffffff && -1 < (int)*(ulong *)pObj) {
    Gia_ManPrintCo_rec(p,pObj + -uVar3);
    Gia_ManPrintCo_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    pGVar2 = p->pObjs;
    if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if ((p->pMuxes != (uint *)0x0) &&
       (uVar1 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555], uVar1 != 0)
       ) {
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (p->nObjs <= (int)(uVar1 >> 1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Gia_ManPrintCo_rec(p,pGVar2 + (uVar1 >> 1));
    }
  }
  Gia_ObjPrint(p,pObj);
  return;
}

Assistant:

void Gia_ManPrintCo_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManPrintCo_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ManPrintCo_rec( p, Gia_ObjFanin1(pObj) );
        if ( Gia_ObjIsMux(p, pObj) )
            Gia_ManPrintCo_rec( p, Gia_ObjFanin2(p, pObj) );
    }
    Gia_ObjPrint( p, pObj );
}